

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

Image * __thiscall sf::Texture::copyToImage(Texture *this)

{
  PFNGLGETTEXIMAGEPROC p_Var1;
  bool bVar2;
  ulong __n;
  reference pvVar3;
  Vector2<unsigned_int> *in_RSI;
  Image *in_RDI;
  uint i;
  uint dstPitch;
  int srcPitch;
  Uint8 *dst;
  Uint8 *src;
  vector<unsigned_char,_std::allocator<unsigned_char>_> allPixels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  TextureSaver save;
  TransientContextLock lock;
  Image *image;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint uVar4;
  allocator_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  reference local_78;
  reference local_70;
  undefined1 local_61 [33];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40 [2];
  
  if (in_RSI[2].x == 0) {
    Image::Image((Image *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  else {
    GlResource::TransientContextLock::TransientContextLock
              ((TransientContextLock *)in_stack_ffffffffffffff20);
    priv::TextureSaver::TextureSaver((TextureSaver *)0x1ff6b0);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1ff6d9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1ff6ff);
    bVar2 = sf::operator==(in_RSI,in_RSI + 1);
    if ((bVar2) && ((in_RSI[2].y & 0x1000000) == 0)) {
      (*sf_glad_glBindTexture)(0xde1,in_RSI[2].x);
      p_Var1 = sf_glad_glGetTexImage;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
      (*p_Var1)(0xde1,0,0x1908,0x1401,pvVar3);
    }
    else {
      __n = (ulong)(in_RSI[1].x * in_RSI[1].y * 4);
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_61;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1ff815);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (this_00,__n,in_stack_ffffffffffffff20);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1ff83b);
      (*sf_glad_glBindTexture)(0xde1,in_RSI[2].x);
      in_stack_ffffffffffffff20 = (allocator_type *)sf_glad_glGetTexImage;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_61 + 1),0)
      ;
      (*(code *)in_stack_ffffffffffffff20)(0xde1,0,0x1908,0x1401,pvVar3);
      local_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_61 + 1),
                            0);
      local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
      in_stack_ffffffffffffff84 = in_RSI[1].x * 4;
      in_stack_ffffffffffffff80 = in_RSI->x << 2;
      if ((in_RSI[2].y & 0x1000000) != 0) {
        local_70 = local_70 + in_stack_ffffffffffffff84 * (in_RSI->y - 1);
        in_stack_ffffffffffffff84 = in_RSI[1].x * -4;
      }
      for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < in_RSI->y;
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
        memcpy(local_78,local_70,(ulong)in_stack_ffffffffffffff80);
        local_70 = local_70 + in_stack_ffffffffffffff84;
        local_78 = local_78 + in_stack_ffffffffffffff80;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff20)
      ;
    }
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 & 0xffffff;
    Image::Image((Image *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    uVar4 = in_RSI->x;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
    Image::create((Image *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,(Uint8 *)in_RSI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff20);
    priv::TextureSaver::~TextureSaver((TextureSaver *)0x1ffa86);
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(uVar4,in_stack_ffffffffffffff10));
  }
  return in_RDI;
}

Assistant:

Image Texture::copyToImage() const
{
    // Easy case: empty texture
    if (!m_texture)
        return Image();

    TransientContextLock lock;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    // Create an array of pixels
    std::vector<Uint8> pixels(m_size.x * m_size.y * 4);

#ifdef SFML_OPENGL_ES

    // OpenGL ES doesn't have the glGetTexImage function, the only way to read
    // from a texture is to bind it to a FBO and use glReadPixels
    GLuint frameBuffer = 0;
    glCheck(GLEXT_glGenFramebuffers(1, &frameBuffer));
    if (frameBuffer)
    {
        GLint previousFrameBuffer;
        glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &previousFrameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));
        glCheck(glReadPixels(0,
                             0,
                             static_cast<GLsizei>(m_size.x),
                             static_cast<GLsizei>(m_size.y),
                             GL_RGBA,
                             GL_UNSIGNED_BYTE,
                             &pixels[0]));
        glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, static_cast<GLuint>(previousFrameBuffer)));

        if (m_pixelsFlipped)
        {
            // Flip the texture vertically
            const int stride        = static_cast<int>(m_size.x * 4);
            Uint8*    currentRowPtr = pixels.data();
            Uint8*    nextRowPtr    = pixels.data() + stride;
            Uint8*    reverseRowPtr = pixels.data() + (stride * static_cast<int>(m_size.y - 1));
            for (unsigned int y = 0; y < m_size.y / 2; ++y)
            {
                std::swap_ranges(currentRowPtr, nextRowPtr, reverseRowPtr);
                currentRowPtr = nextRowPtr;
                nextRowPtr += stride;
                reverseRowPtr -= stride;
            }
        }
    }

#else

    if ((m_size == m_actualSize) && !m_pixelsFlipped)
    {
        // Texture is not padded nor flipped, we can use a direct copy
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]));
    }
    else
    {
        // Texture is either padded or flipped, we have to use a slower algorithm

        // All the pixels will first be copied to a temporary array
        std::vector<Uint8> allPixels(m_actualSize.x * m_actualSize.y * 4);
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &allPixels[0]));

        // Then we copy the useful pixels from the temporary array to the final one
        const Uint8* src = &allPixels[0];
        Uint8* dst = &pixels[0];
        int srcPitch = static_cast<int>(m_actualSize.x * 4);
        unsigned int dstPitch = m_size.x * 4;

        // Handle the case where source pixels are flipped vertically
        if (m_pixelsFlipped)
        {
            src += static_cast<unsigned int>(srcPitch * static_cast<int>((m_size.y - 1)));
            srcPitch = -srcPitch;
        }

        for (unsigned int i = 0; i < m_size.y; ++i)
        {
            std::memcpy(dst, src, dstPitch);
            src += srcPitch;
            dst += dstPitch;
        }
    }

#endif // SFML_OPENGL_ES

    // Create the image
    Image image;
    image.create(m_size.x, m_size.y, &pixels[0]);

    return image;
}